

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<unsigned_int> * __thiscall
vkb::Device::get_queue_index
          (Result<unsigned_int> *__return_storage_ptr__,Device *this,QueueType type)

{
  bool bVar1;
  uint32_t uVar2;
  pointer pVVar3;
  ulong uVar4;
  ulong uVar5;
  
  switch(type) {
  case present:
    uVar2 = detail::get_present_queue_index
                      ((this->physical_device).physical_device,this->surface,&this->queue_families);
    if (uVar2 == 0xffffffff) {
      bVar1 = false;
      (__return_storage_ptr__->field_0).m_value = 0;
      *(undefined8 **)((long)&__return_storage_ptr__->field_0 + 8) = &detail::queue_error_category;
      (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
      goto LAB_00108d4a;
    }
    break;
  case graphics:
    pVVar3 = (this->queue_families).
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->queue_families).
                   super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 3) *
            -0x5555555555555555;
    uVar2 = 0xffffffff;
    if ((int)uVar4 != 0) {
      uVar5 = 0;
      do {
        if ((pVVar3->queueFlags & 1) != 0) {
          uVar2 = (uint32_t)uVar5;
          break;
        }
        uVar5 = uVar5 + 1;
        pVVar3 = pVVar3 + 1;
      } while ((uVar4 & 0xffffffff) != uVar5);
    }
    if (uVar2 == 0xffffffff) {
      (__return_storage_ptr__->field_0).m_value = 1;
      goto LAB_00108d36;
    }
    break;
  case compute:
    uVar2 = detail::get_separate_queue_index(&this->queue_families,2,4);
    if (uVar2 == 0xffffffff) {
      (__return_storage_ptr__->field_0).m_value = 2;
      goto LAB_00108d36;
    }
    break;
  case transfer:
    uVar2 = detail::get_separate_queue_index(&this->queue_families,4,2);
    if (uVar2 == 0xffffffff) {
      (__return_storage_ptr__->field_0).m_value = 3;
      goto LAB_00108d36;
    }
    break;
  default:
    (__return_storage_ptr__->field_0).m_value = 5;
LAB_00108d36:
    *(undefined8 **)((long)&__return_storage_ptr__->field_0 + 8) = &detail::queue_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    bVar1 = false;
    goto LAB_00108d4a;
  }
  (__return_storage_ptr__->field_0).m_value = uVar2;
  bVar1 = true;
LAB_00108d4a:
  __return_storage_ptr__->m_init = bVar1;
  return __return_storage_ptr__;
}

Assistant:

Result<uint32_t> Device::get_queue_index(QueueType type) const {
    uint32_t index = detail::QUEUE_INDEX_MAX_VALUE;
    switch (type) {
        case QueueType::present:
            index = detail::get_present_queue_index(physical_device.physical_device, surface, queue_families);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::present_unavailable };
            break;
        case QueueType::graphics:
            index = detail::get_first_queue_index(queue_families, VK_QUEUE_GRAPHICS_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::graphics_unavailable };
            break;
        case QueueType::compute:
            index = detail::get_separate_queue_index(queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::compute_unavailable };
            break;
        case QueueType::transfer:
            index = detail::get_separate_queue_index(queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::transfer_unavailable };
            break;
        default:
            return Result<uint32_t>{ QueueError::invalid_queue_family_index };
    }
    return index;
}